

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O1

void __thiscall Population::process(Population *this)

{
  pointer pCVar1;
  ulong uVar2;
  long lVar3;
  Chromosome *chromo;
  pointer pCVar4;
  undefined1 auVar5 [16];
  double dVar6;
  pointer local_30;
  pointer local_28;
  
  pCVar1 = (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
           super__Vector_impl_data._M_finish;
  dVar6 = 0.0;
  for (pCVar4 = (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>.
                _M_impl.super__Vector_impl_data._M_start; pCVar4 != pCVar1; pCVar4 = pCVar4 + 1) {
    Chromosome::process(pCVar4);
    dVar6 = dVar6 + pCVar4->fitness;
  }
  local_30 = (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl
             .super__Vector_impl_data._M_start;
  local_28 = (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl
             .super__Vector_impl_data._M_finish;
  if ((long)local_28 - (long)local_30 != 0) {
    uVar2 = ((long)local_28 - (long)local_30 >> 5) * -0x5555555555555555;
    lVar3 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<std::reverse_iterator<__gnu_cxx::__normal_iterator<Chromosome*,std::vector<Chromosome,std::allocator<Chromosome>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (&local_28,&local_30,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<Chromosome*,std::vector<Chromosome,std::allocator<Chromosome>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ();
  }
  pCVar4 = (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this->minFitness = pCVar1[-1].fitness;
  lVar3 = ((long)pCVar1 - (long)pCVar4 >> 5) * -0x5555555555555555;
  auVar5._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar5._0_8_ = lVar3;
  auVar5._12_4_ = 0x45300000;
  this->maxFitness = pCVar4->fitness;
  this->averageFitness =
       dVar6 / ((auVar5._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
  return;
}

Assistant:

void Population::process() {

    double totalFitness = 0;
    // re-calculate changed chromosomes
    for (Chromosome& chromo : chromosomes){
        chromo.process();
        totalFitness += chromo.getFitness();
    }
    // sort list by fitness
    std::sort(chromosomes.rbegin(), chromosomes.rend());
    // calculate min/max fitness of population

    minFitness = chromosomes.back().getFitness();
    maxFitness = chromosomes.front().getFitness();
    averageFitness = totalFitness/chromosomes.size();
}